

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Privkey::SignMessage
          (ByteData *__return_storage_ptr__,Privkey *this,string *message,string *message_magic)

{
  undefined1 local_40 [8];
  ByteData256 hash;
  string *message_magic_local;
  string *message_local;
  Privkey *this_local;
  
  hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)message_magic;
  HashMessage((ByteData256 *)local_40,message,message_magic);
  SignatureUtil::CalculateEcSignature
            (__return_storage_ptr__,(ByteData256 *)local_40,this,false,true);
  ByteData256::~ByteData256((ByteData256 *)0x473b74);
  return __return_storage_ptr__;
}

Assistant:

ByteData Privkey::SignMessage(
    const std::string &message, const std::string &message_magic) const {
  ByteData256 hash = HashMessage(message, message_magic);
  return SignatureUtil::CalculateEcSignature(hash, *this, false, true);
}